

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventCount.hpp
# Opt level: O2

void __thiscall EventCount::doNotify(EventCount *this,int n)

{
  __int_type _Var1;
  
  LOCK();
  _Var1 = (this->val_).super___atomic_base<unsigned_long>._M_i;
  (this->val_).super___atomic_base<unsigned_long>._M_i =
       (this->val_).super___atomic_base<unsigned_long>._M_i + 0x100000000;
  UNLOCK();
  if ((int)_Var1 != 0) {
    futexWakeImpl((Futex<std::atomic> *)
                  ((long)&(this->val_).super___atomic_base<unsigned_long>._M_i + 4),n,0xffffffff);
  }
  return;
}

Assistant:

inline void EventCount::doNotify(int n) noexcept {
    uint64_t prev = val_.fetch_add(kAddEpoch, std::memory_order_acq_rel);
    if (UNLIKELY(prev & kWaiterMask)) {
        futexWake(reinterpret_cast<Futex<std::atomic> *>(&val_) + kEpochOffset, n);
    }
}